

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O3

void CLASSWEIGHTS::predict_or_learn<false,0>
               (classweights *cweights,single_learner *base,example *ec)

{
  iterator iVar1;
  float fVar2;
  key_type_conflict1 local_14;
  
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)cweights,&local_14);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_float>,_false>._M_cur ==
      (__node_type *)0x0) {
    fVar2 = 1.0;
  }
  else {
    fVar2 = *(float *)((long)iVar1.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_float>,_false>.
                             _M_cur + 0xc);
  }
  ec->weight = fVar2 * ec->weight;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  return;
}

Assistant:

static void predict_or_learn(classweights& cweights, LEARNER::single_learner& base, example& ec)
{
  switch (pred_type)
  {
    case prediction_type::scalar:
      ec.weight *= cweights.get_class_weight((uint32_t)ec.l.simple.label);
      break;
    case prediction_type::multiclass:
      ec.weight *= cweights.get_class_weight(ec.l.multi.label);
      break;
    default:
      // suppress the warning
      break;
  }

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);
}